

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_queue.c
# Opt level: O3

void * uo_queue_dequeue(uo_queue *queue,_Bool should_block)

{
  atomic_size_t *paVar1;
  ulong uVar2;
  void *pvVar3;
  int iVar4;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,should_block) == 0) {
    iVar4 = sem_trywait((sem_t *)&queue->dequeue_sem);
    if (iVar4 == -1) {
      return (void *)0x0;
    }
  }
  else {
    sem_wait((sem_t *)&queue->dequeue_sem);
  }
  LOCK();
  paVar1 = &queue->tail;
  uVar2 = *paVar1;
  *paVar1 = *paVar1 + 1;
  UNLOCK();
  pvVar3 = queue->items[uVar2 % queue->capasity];
  sem_post((sem_t *)&queue->enqueue_sem);
  return pvVar3;
}

Assistant:

void *uo_queue_dequeue(
    uo_queue *queue, 
    bool should_block)
{
    if (should_block)
        sem_wait((sem_t *)&queue->dequeue_sem);
    else if (sem_trywait((sem_t *)&queue->dequeue_sem) == -1)
        return NULL;

    size_t tail = atomic_fetch_add(&queue->tail, 1);
    void *item = queue->items[tail % queue->capasity];
    sem_post((sem_t *)&queue->enqueue_sem);

    return item;
}